

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O1

void __thiscall MidiInApi::ignoreTypes(MidiInApi *this,bool midiSysex,bool midiTime,bool midiSense)

{
  uchar *puVar1;
  uchar uVar2;
  undefined3 in_register_00000009;
  undefined3 in_register_00000011;
  
  uVar2 = midiSysex + '\x02';
  if (CONCAT31(in_register_00000011,midiTime) == 0) {
    uVar2 = midiSysex;
  }
  (this->inputData_).ignoreFlags = uVar2;
  if (CONCAT31(in_register_00000009,midiSense) != 0) {
    puVar1 = &(this->inputData_).ignoreFlags;
    *puVar1 = *puVar1 | 4;
  }
  return;
}

Assistant:

void MidiInApi :: ignoreTypes( bool midiSysex, bool midiTime, bool midiSense )
{
  inputData_.ignoreFlags = 0;
  if ( midiSysex ) inputData_.ignoreFlags = 0x01;
  if ( midiTime ) inputData_.ignoreFlags |= 0x02;
  if ( midiSense ) inputData_.ignoreFlags |= 0x04;
}